

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O2

vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_> * __thiscall
sfc::Palette::subpalettes_matching
          (vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>
           *__return_storage_ptr__,Palette *this,Image *image)

{
  pointer pSVar1;
  uint uVar2;
  runtime_error *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  Subpalette *sp;
  pointer this_01;
  string_view fmt;
  format_args args;
  rgba_vec_t rc;
  rgba_set_t cs;
  Subpalette *local_78 [2];
  ulong local_68;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Image::rgba_data((rgba_vec_t *)&cs,image);
  reduce_colors(&rc,(rgba_vec_t *)&cs,this->_mode);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&cs);
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&cs,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )rc.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )rc.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
  if (cs._M_t._M_impl.super__Rb_tree_header._M_node_count <= this->_max_colors_per_subpalette) {
    pSVar1 = (this->_subpalettes).
             super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_01 = (this->_subpalettes).
                   super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                   super__Vector_impl_data._M_start; this_01 != pSVar1; this_01 = this_01 + 1) {
      uVar2 = Subpalette::diff(this_01,&cs);
      if (uVar2 == 0) {
        local_78[0] = this_01;
        std::vector<sfc::Subpalette_const*,std::allocator<sfc::Subpalette_const*>>::
        emplace_back<sfc::Subpalette_const*>
                  ((vector<sfc::Subpalette_const*,std::allocator<sfc::Subpalette_const*>> *)
                   __return_storage_ptr__,local_78);
      }
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&cs._M_t);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&rc.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_78[0] = (Subpalette *)(ulong)image->_src_coord_x;
  local_68 = (ulong)image->_src_coord_y;
  fmt.size_ = 0x22;
  fmt.data_ = (char *)0x3a;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_78;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_50,(v10 *)"Tile with too many unique colors at {},{} in source image\n",fmt,args
            );
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<const Subpalette*> Palette::subpalettes_matching(const Image& image) const {
  std::vector<const Subpalette*> sv;

  auto rc = reduce_colors(image.rgba_data(), _mode);
  rgba_set_t cs(rc.begin(), rc.end());

  if (cs.size() > _max_colors_per_subpalette) {
    throw std::runtime_error(
      fmt::format("Tile with too many unique colors at {},{} in source image\n", image.src_coord_x(), image.src_coord_y()));
  }

  for (const Subpalette& sp : _subpalettes) {
    if (sp.diff(cs) == 0)
      sv.push_back(&sp);
  }

  return sv;
}